

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void makeRoomAtIndex(run_container_t *run,uint16_t index)

{
  uint16_t index_local;
  run_container_t *run_local;
  
  if (run->capacity < run->n_runs + 1) {
    run_container_grow(run,run->n_runs + 1,true);
  }
  memmove(run->runs + (long)(int)(uint)index + 1,run->runs + (int)(uint)index,
          (long)(int)(run->n_runs - (uint)index) << 2);
  run->n_runs = run->n_runs + 1;
  return;
}

Assistant:

static inline void makeRoomAtIndex(run_container_t *run, uint16_t index) {
    /* This function calls realloc + memmove sequentially to move by one index.
     * Potentially copying twice the array.
     */
    if (run->n_runs + 1 > run->capacity)
        run_container_grow(run, run->n_runs + 1, true);
    memmove(run->runs + 1 + index, run->runs + index,
            (run->n_runs - index) * sizeof(rle16_t));
    run->n_runs++;
}